

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::setupViewport(QMdiArea *this,QWidget *viewport)

{
  QPointer<QMdiSubWindow> *pQVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  QWidget *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if (viewport != (QWidget *)0x0) {
    bVar3 = (bool)QBrush::isOpaque();
    QWidget::setAttribute(viewport,WA_OpaquePaintEvent,bVar3);
  }
  local_50.d = *(Data **)(lVar4 + 0x358);
  pQVar1 = *(QPointer<QMdiSubWindow> **)(lVar4 + 0x360);
  local_50.size = *(long *)(lVar4 + 0x368);
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  lVar5 = local_50.size * 0x10;
  local_50.ptr = pQVar1;
  for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 0x10) {
    lVar2 = *(long *)((long)&(pQVar1->wp).d + lVar4);
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      this_00 = (QWidget *)0x0;
    }
    else {
      this_00 = *(QWidget **)((long)&(pQVar1->wp).value + lVar4);
    }
    bVar3 = sanityCheck((QMdiSubWindow *)this_00,"QMdiArea::setupViewport");
    if (bVar3) {
      QWidget::setParent(this_00,viewport,
                         (WindowFlags)
                         (this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                         super_QFlagsStorage<Qt::WindowType>.i);
    }
  }
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::setupViewport(QWidget *viewport)
{
    Q_D(QMdiArea);
    if (viewport)
        viewport->setAttribute(Qt::WA_OpaquePaintEvent, d->background.isOpaque());
    // Take a copy because the child->setParent() call below may call QCoreApplication::sendEvent()
    // which may call unknown code that could e.g. recurse into the class modifying d->childWindows.
    const auto subWindows = d->childWindows;
    for (QMdiSubWindow *child : subWindows) {
        if (!sanityCheck(child, "QMdiArea::setupViewport"))
            continue;
        child->setParent(viewport, child->windowFlags());
    }
}